

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdf.h
# Opt level: O0

bool __thiscall pbrt::BSDF::HasTransmission(BSDF *this)

{
  BxDFFlags a;
  int iVar1;
  
  a = BxDFHandle::Flags((BxDFHandle *)this);
  iVar1 = operator&(a,Transmission);
  return iVar1 != 0;
}

Assistant:

PBRT_CPU_GPU
    bool HasTransmission() const { return (bxdf.Flags() & BxDFFlags::Transmission); }